

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O2

optional<pbrt::ShapeIntersection> * __thiscall
pbrt::BilinearPatch::Intersect
          (optional<pbrt::ShapeIntersection> *__return_storage_ptr__,BilinearPatch *this,Ray *ray,
          Float tMax)

{
  Float time;
  int patchIndex;
  BilinearPatchMesh *mesh;
  int *piVar1;
  Point3f *pPVar2;
  long lVar3;
  BilinearIntersection *pBVar4;
  undefined1 auVar6 [56];
  undefined1 auVar5 [64];
  Vector3<float> VVar7;
  optional<pbrt::BilinearIntersection> blpIsect;
  SurfaceInteraction intr;
  undefined1 local_248 [16];
  Tuple2<pbrt::Point2,_float> local_238;
  undefined8 uStack_230;
  ShapeIntersection local_228;
  SurfaceInteraction local_128;
  
  mesh = *(BilinearPatchMesh **)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8);
  lVar3 = (long)this->blpIndex;
  piVar1 = mesh->vertexIndices;
  pPVar2 = mesh->p;
  IntersectBilinearPatch
            ((Ray *)local_248,tMax,&ray->o,pPVar2 + piVar1[lVar3 * 4],pPVar2 + piVar1[lVar3 * 4 + 1]
             ,pPVar2 + piVar1[lVar3 * 4 + 2]);
  if (local_248[0xc] == false) {
    *(undefined8 *)&__return_storage_ptr__->set = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xc0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 200) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x98) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x70) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x78) = 0;
    (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  }
  else {
    patchIndex = this->blpIndex;
    pBVar4 = pstd::optional<pbrt::BilinearIntersection>::value
                       ((optional<pbrt::BilinearIntersection> *)local_248);
    local_238 = (pBVar4->uv).super_Tuple2<pbrt::Point2,_float>;
    uStack_230._0_4_ = 0.0;
    uStack_230._4_4_ = 0;
    time = ray->time;
    auVar6 = (undefined1  [56])0x0;
    VVar7 = Tuple3<pbrt::Vector3,_float>::operator-(&(ray->d).super_Tuple3<pbrt::Vector3,_float>);
    auVar5._0_8_ = VVar7.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar5._8_56_ = auVar6;
    local_228.intr.super_Interaction.pi.super_Point3<pbrt::Interval>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval>.x = (Interval)vmovlps_avx(auVar5._0_16_);
    local_228.intr.super_Interaction.pi.super_Point3<pbrt::Interval>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low = VVar7.super_Tuple3<pbrt::Vector3,_float>.z;
    InteractionFromIntersection
              (&local_128,mesh,patchIndex,(Point2f)local_238,time,(Vector3f *)&local_228);
    local_228.intr.super_Interaction.mediumInterface = local_128.super_Interaction.mediumInterface;
    local_228.intr.super_Interaction.medium.
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
    .bits = local_128.super_Interaction.medium.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
    local_228.intr.super_Interaction.pi.super_Point3<pbrt::Interval>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval>.x =
         local_128.super_Interaction.pi.super_Point3<pbrt::Interval>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
    local_228.intr.super_Interaction.pi.super_Point3<pbrt::Interval>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval>.y =
         local_128.super_Interaction.pi.super_Point3<pbrt::Interval>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval>.y;
    local_228.intr.super_Interaction.pi.super_Point3<pbrt::Interval>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval>.z =
         local_128.super_Interaction.pi.super_Point3<pbrt::Interval>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
    local_228.intr.super_Interaction.time = local_128.super_Interaction.time;
    local_228.intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.x =
         local_128.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.x;
    local_228.intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y =
         local_128.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y;
    local_228.intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z =
         local_128.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z;
    local_228.intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x =
         local_128.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x;
    local_228.intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y =
         local_128.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y;
    local_228.intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z =
         local_128.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z;
    local_228.intr.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x =
         local_128.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x;
    local_228.intr.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.y =
         local_128.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.y;
    local_228.intr.super_Interaction._60_4_ = local_128.super_Interaction._60_4_;
    local_228.intr.dpdu.super_Tuple3<pbrt::Vector3,_float>.x =
         local_128.dpdu.super_Tuple3<pbrt::Vector3,_float>.x;
    local_228.intr.dpdu.super_Tuple3<pbrt::Vector3,_float>.y =
         local_128.dpdu.super_Tuple3<pbrt::Vector3,_float>.y;
    local_228.intr.dpdu.super_Tuple3<pbrt::Vector3,_float>.z =
         local_128.dpdu.super_Tuple3<pbrt::Vector3,_float>.z;
    local_228.intr.dpdv.super_Tuple3<pbrt::Vector3,_float>.x =
         local_128.dpdv.super_Tuple3<pbrt::Vector3,_float>.x;
    local_228.intr.dpdv.super_Tuple3<pbrt::Vector3,_float>.y =
         local_128.dpdv.super_Tuple3<pbrt::Vector3,_float>.y;
    local_228.intr.dpdv.super_Tuple3<pbrt::Vector3,_float>.z =
         local_128.dpdv.super_Tuple3<pbrt::Vector3,_float>.z;
    local_228.intr.dndu.super_Tuple3<pbrt::Normal3,_float>.x =
         local_128.dndu.super_Tuple3<pbrt::Normal3,_float>.x;
    local_228.intr.dndu.super_Tuple3<pbrt::Normal3,_float>.y =
         local_128.dndu.super_Tuple3<pbrt::Normal3,_float>.y;
    local_228.intr.dndu.super_Tuple3<pbrt::Normal3,_float>.z =
         local_128.dndu.super_Tuple3<pbrt::Normal3,_float>.z;
    local_228.intr.dndv.super_Tuple3<pbrt::Normal3,_float>.x =
         local_128.dndv.super_Tuple3<pbrt::Normal3,_float>.x;
    local_228.intr.dndv.super_Tuple3<pbrt::Normal3,_float>.y =
         local_128.dndv.super_Tuple3<pbrt::Normal3,_float>.y;
    local_228.intr.dndv.super_Tuple3<pbrt::Normal3,_float>.z =
         local_128.dndv.super_Tuple3<pbrt::Normal3,_float>.z;
    local_228.intr.shading.n.super_Tuple3<pbrt::Normal3,_float>.x =
         local_128.shading.n.super_Tuple3<pbrt::Normal3,_float>.x;
    local_228.intr.shading.n.super_Tuple3<pbrt::Normal3,_float>.y =
         local_128.shading.n.super_Tuple3<pbrt::Normal3,_float>.y;
    local_228.intr.shading.n.super_Tuple3<pbrt::Normal3,_float>.z =
         local_128.shading.n.super_Tuple3<pbrt::Normal3,_float>.z;
    local_228.intr.shading.dpdu.super_Tuple3<pbrt::Vector3,_float>.x =
         local_128.shading.dpdu.super_Tuple3<pbrt::Vector3,_float>.x;
    local_228.intr.shading.dpdu.super_Tuple3<pbrt::Vector3,_float>.y =
         local_128.shading.dpdu.super_Tuple3<pbrt::Vector3,_float>.y;
    local_228.intr.shading.dpdu.super_Tuple3<pbrt::Vector3,_float>.z =
         local_128.shading.dpdu.super_Tuple3<pbrt::Vector3,_float>.z;
    local_228.intr.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.x =
         local_128.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.x;
    local_228.intr.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.y =
         local_128.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.y;
    local_228.intr.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.z =
         local_128.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.z;
    local_228.intr.shading.dndu.super_Tuple3<pbrt::Normal3,_float>.x =
         local_128.shading.dndu.super_Tuple3<pbrt::Normal3,_float>.x;
    local_228.intr.shading.dndu.super_Tuple3<pbrt::Normal3,_float>.y =
         local_128.shading.dndu.super_Tuple3<pbrt::Normal3,_float>.y;
    local_228.intr.shading.dndu.super_Tuple3<pbrt::Normal3,_float>.z =
         local_128.shading.dndu.super_Tuple3<pbrt::Normal3,_float>.z;
    local_228.intr.shading.dndv.super_Tuple3<pbrt::Normal3,_float>.x =
         local_128.shading.dndv.super_Tuple3<pbrt::Normal3,_float>.x;
    local_228.intr.shading.dndv.super_Tuple3<pbrt::Normal3,_float>.y =
         local_128.shading.dndv.super_Tuple3<pbrt::Normal3,_float>.y;
    local_228.intr.shading.dndv.super_Tuple3<pbrt::Normal3,_float>.z =
         local_128.shading.dndv.super_Tuple3<pbrt::Normal3,_float>.z;
    local_228.intr.faceIndex = local_128.faceIndex;
    local_228.intr.material.
    super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
    .bits = local_128.material.
            super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
            .bits;
    local_228.intr.areaLight.
    super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
    .bits = local_128.areaLight.
            super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
            .bits;
    local_228.intr.dudy = local_128.dudy;
    local_228.intr.dvdy = local_128.dvdy;
    local_228.intr.dpdx.super_Tuple3<pbrt::Vector3,_float>.x =
         local_128.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
    local_228.intr.dpdx.super_Tuple3<pbrt::Vector3,_float>.y =
         local_128.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
    local_228.intr.dpdx.super_Tuple3<pbrt::Vector3,_float>.z =
         local_128.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
    local_228.intr.dpdy.super_Tuple3<pbrt::Vector3,_float>.x =
         local_128.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
    local_228.intr.dpdy.super_Tuple3<pbrt::Vector3,_float>.y =
         local_128.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
    local_228.intr.dpdy.super_Tuple3<pbrt::Vector3,_float>.z =
         local_128.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
    local_228.intr.dudx = local_128.dudx;
    local_228.intr.dvdx = local_128.dvdx;
    pBVar4 = pstd::optional<pbrt::BilinearIntersection>::value
                       ((optional<pbrt::BilinearIntersection> *)local_248);
    local_228.tHit = pBVar4->t;
    pstd::optional<pbrt::ShapeIntersection>::optional(__return_storage_ptr__,&local_228);
  }
  pstd::optional<pbrt::BilinearIntersection>::~optional
            ((optional<pbrt::BilinearIntersection> *)local_248);
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<ShapeIntersection> BilinearPatch::Intersect(const Ray &ray,
                                                           Float tMax) const {
    // Get bilinear patch vertices in _p00_, _p01_, _p10_, and _p11_
    const BilinearPatchMesh *mesh = GetMesh();
    const int *v = &mesh->vertexIndices[4 * blpIndex];
    const Point3f &p00 = mesh->p[v[0]], &p10 = mesh->p[v[1]];
    const Point3f &p01 = mesh->p[v[2]], &p11 = mesh->p[v[3]];

    pstd::optional<BilinearIntersection> blpIsect =
        IntersectBilinearPatch(ray, tMax, p00, p10, p01, p11);
    if (!blpIsect)
        return {};
    SurfaceInteraction intr =
        InteractionFromIntersection(mesh, blpIndex, blpIsect->uv, ray.time, -ray.d);
    return ShapeIntersection{intr, blpIsect->t};
}